

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_enable_msix(int device_fd,uint32_t interrupt_vector)

{
  __off_t __offset;
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  size_t sVar8;
  void *pvVar9;
  int __timeout;
  epoll_event *__events;
  code *pcVar10;
  undefined4 uVar11;
  ulong uVar12;
  char *__buf;
  undefined1 *puVar13;
  undefined1 *puVar14;
  epoll_event *peVar15;
  long lVar16;
  char *pcVar17;
  char irq_set_buf [152];
  char buf [512];
  undefined8 auStack_30f0 [2];
  size_t asStack_30e0 [67];
  long lStack_2ec8;
  int iStack_2ec0;
  uint uStack_2ebc;
  undefined8 uStack_2eb8;
  undefined1 auStack_2eb0 [512];
  stat sStack_2cb0;
  char acStack_2c20 [4096];
  char acStack_1c20 [4096];
  ulong auStack_c20 [3];
  epoll_event aeStack_c04 [33];
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  epoll_event aeStack_9e0 [32];
  undefined1 auStack_7e0 [8];
  ulong uStack_7d8;
  undefined1 *puStack_7d0;
  char *pcStack_7c8;
  char *pcStack_7c0;
  char *pcStack_7b8;
  code *pcStack_7b0;
  ulong uStack_7a8;
  int iStack_7a0;
  undefined4 uStack_79c;
  undefined1 auStack_798 [520];
  ulong uStack_590;
  undefined1 auStack_4c0 [512];
  code *pcStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint32_t local_2a8;
  int local_2a4;
  undefined1 local_218 [512];
  
  pcStack_2c0 = (code *)0x101c8a;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  pcStack_2c0 = (code *)0x101c93;
  iVar2 = eventfd(0,0);
  uVar3 = 0x21;
  if (interrupt_vector < 0x21) {
    uVar3 = interrupt_vector;
  }
  local_2a8 = 1;
  if (interrupt_vector != 0) {
    local_2a8 = uVar3;
  }
  local_2b8 = 0x2400000098;
  uStack_2b0 = 2;
  pcStack_2c0 = (code *)0x101cd0;
  local_2a4 = iVar2;
  iVar4 = ioctl(device_fd,0x3b6e);
  if (iVar4 != -1) {
    return iVar2;
  }
  puVar13 = local_218;
  pcStack_2c0 = vfio_disable_msix;
  vfio_enable_msix_cold_1();
  pcStack_2c0 = (code *)(ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar2 = ioctl((int)puVar13,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar14 = auStack_4c0;
  vfio_disable_msix_cold_1();
  pcVar17 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c";
  pcStack_7b0 = (code *)0x101daa;
  uStack_590 = (ulong)puVar13 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar10 = (code *)0x2;
  while( true ) {
    uVar12 = 0x3b6d;
    uStack_7a8 = 0x10;
    iVar4 = (int)pcVar10;
    uStack_79c = 0;
    pcStack_7b0 = (code *)0x101dde;
    iStack_7a0 = iVar4;
    iVar2 = ioctl((int)puVar14,0x3b6d,&uStack_7a8);
    if (iVar2 == -1) break;
    if ((uStack_7a8 & 0x100000000) != 0) goto LAB_00101e13;
    pcStack_7b0 = (code *)0x101e09;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    pcVar10 = (code *)(ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      pcVar10 = (code *)0xffffffff;
LAB_00101e13:
      return (int)pcVar10;
    }
  }
  iVar2 = (int)auStack_798;
  pcStack_7b0 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_1();
  pcStack_7b8 = "vfio_setup_interrupt";
  pcStack_7c0 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
  ;
  pcStack_7c8 = "[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n";
  lVar1 = -((uVar12 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_9e0 + lVar1);
  uStack_7d8 = (ulong)puVar14 & 0xffffffff;
  puStack_7d0 = (undefined1 *)&uStack_7a8;
  pcStack_7b0 = pcVar10;
  *(undefined8 *)((long)&uStack_9e8 + lVar1) = 0x101e6c;
  uVar5 = epoll_wait(iVar2,__events,(int)uVar12,__timeout);
  if (uVar5 != 0xffffffff) {
    pcVar17 = (char *)(ulong)uVar5;
    if (0 < (int)uVar5) {
      lVar16 = 0;
      do {
        iVar2 = *(int *)((long)aeStack_9e0 + lVar16 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_9e8 + lVar1) = 0x101e9c;
        sVar7 = read(iVar2,auStack_7e0,8);
        if (sVar7 == -1) {
          *(undefined8 *)((long)&uStack_9e8 + lVar1) = 0x101ec9;
          vfio_epoll_wait_cold_1();
          goto LAB_00101ec9;
        }
        lVar16 = lVar16 + 0xc;
      } while ((long)pcVar17 * 0xc != lVar16);
    }
    return uVar5;
  }
LAB_00101ec9:
  peVar15 = aeStack_9e0;
  *(code **)((long)&uStack_9e8 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_9e8 + lVar1) = &pcStack_7b0;
  *(epoll_event **)((long)&uStack_9f0 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_c04 + lVar1) = 1;
  *(int *)((long)aeStack_c04 + lVar1 + 4) = (int)peVar15;
  *(undefined8 *)((long)auStack_c20 + lVar1 + 0x10) = 0x101ef3;
  uVar5 = epoll_create1(0);
  if (uVar5 == 0xffffffff) {
    *(undefined8 *)((long)auStack_c20 + lVar1 + 0x10) = 0x101f28;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar5;
    *(undefined8 *)((long)auStack_c20 + lVar1 + 0x10) = 0x101f0d;
    iVar2 = epoll_ctl(uVar5,1,(int)peVar15,(epoll_event *)((long)aeStack_c04 + lVar1));
    if (iVar2 != -1) {
      return uVar5;
    }
  }
  lVar16 = (long)aeStack_c04 + lVar1 + 0xc;
  *(code **)((long)auStack_c20 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_c20 + lVar1 + 0x10) = (ulong)peVar15 & 0xffffffff;
  *(char **)((long)auStack_c20 + lVar1 + 8) = pcVar17;
  *(epoll_event **)((long)auStack_c20 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101f61;
  snprintf(acStack_1c20 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar16);
  *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101f71;
  iVar2 = stat(acStack_1c20 + lVar1,(stat *)((long)&sStack_2cb0 + lVar1));
  if (iVar2 < 0) {
    return -1;
  }
  pcVar17 = acStack_1c20 + lVar1;
  *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101f89;
  sVar8 = strlen(pcVar17);
  *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101fa0;
  strncat(pcVar17,"iommu_group",0xfff - sVar8);
  __buf = acStack_2c20 + lVar1;
  *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101fb5;
  sVar7 = readlink(pcVar17,__buf,0x1000);
  uVar11 = SUB84(__buf,0);
  if (sVar7 == -1) {
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10214a;
    vfio_init_cold_11();
LAB_0010214a:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102154;
    vfio_init_cold_10();
LAB_00102154:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10215e;
    vfio_init_cold_8();
LAB_0010215e:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102168;
    vfio_init_cold_7();
LAB_00102168:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102172;
    vfio_init_cold_6();
LAB_00102172:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10217c;
    vfio_init_cold_5();
LAB_0010217c:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102186;
    vfio_init_cold_3();
LAB_00102186:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102190;
    vfio_init_cold_9();
LAB_00102190:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10219a;
    vfio_init_cold_1();
LAB_0010219a:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x1021a4;
    vfio_init_cold_2();
  }
  else {
    acStack_2c20[(int)sVar7 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101fd6;
    pcVar17 = __xpg_basename(acStack_2c20 + lVar1);
    uVar11 = 0x1034ad;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101fec;
    iVar2 = __isoc99_sscanf(pcVar17,"%d",(long)&uStack_2ebc + lVar1);
    if (iVar2 == -1) goto LAB_0010214a;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x101ffc;
    iVar2 = get_vfio_container();
    *(int *)((long)&iStack_2ec0 + lVar1) = iVar2;
    if (iVar2 == -1) {
      uVar11 = 2;
      *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102019;
      iVar4 = open("/dev/vfio/vfio",2);
      if (iVar4 == -1) goto LAB_00102186;
      *(int *)((long)&iStack_2ec0 + lVar1) = iVar4;
      *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10202f;
      set_vfio_container(iVar4);
      uVar11 = 0x3b64;
      *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10203e;
      iVar6 = ioctl(iVar4,0x3b64);
      if (iVar6 != 0) goto LAB_00102190;
      uVar11 = 0x3b65;
      *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10205a;
      iVar4 = ioctl(iVar4,0x3b65,1);
      if (iVar4 == 1) goto LAB_00102063;
      goto LAB_0010219a;
    }
LAB_00102063:
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102085;
    snprintf(acStack_1c20 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_2ebc + lVar1)
            );
    uVar11 = 2;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102094;
    iVar4 = open(acStack_1c20 + lVar1,2);
    if (iVar4 == -1) goto LAB_00102154;
    uVar11 = 0x3b67;
    *(undefined8 *)((long)&uStack_2eb8 + lVar1) = 8;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x1020ba;
    iVar6 = ioctl(iVar4,0x3b67);
    if (iVar6 == -1) goto LAB_0010215e;
    if ((auStack_2eb0[lVar1 + -4] & 1) == 0) goto LAB_00102168;
    uVar11 = 0x3b68;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x1020e0;
    iVar6 = ioctl(iVar4,0x3b68,(long)&iStack_2ec0 + lVar1);
    if (iVar6 == -1) goto LAB_00102172;
    if (iVar2 != -1) {
LAB_0010210b:
      uVar11 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10211d;
      iVar2 = ioctl(iVar4,0x3b6a,lVar16);
      if (iVar2 != -1) {
        *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x10212b;
        vfio_enable_dma(iVar2);
        return iVar2;
      }
      goto LAB_0010217c;
    }
    uVar11 = 0x3b66;
    *(undefined8 *)((long)&lStack_2ec8 + lVar1) = 0x102102;
    iVar2 = ioctl(*(int *)((long)&iStack_2ec0 + lVar1),0x3b66,1);
    if (iVar2 != -1) goto LAB_0010210b;
  }
  iVar2 = (int)auStack_2eb0 + (int)lVar1;
  *(code **)((long)&lStack_2ec8 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2ec8 + lVar1) = lVar16;
  *(undefined8 *)((long)auStack_30f0 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_30e0 + lVar1) = 0;
  *(undefined8 *)((long)asStack_30e0 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_30e0 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_30e0 + lVar1) = uVar11;
  *(undefined8 *)((long)auStack_30f0 + lVar1) = 0x1021d9;
  iVar4 = ioctl(iVar2,0x3b6c);
  if (iVar4 != -1) {
    sVar8 = *(size_t *)((long)asStack_30e0 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_30e0 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_30f0 + lVar1) = 0x1021fc;
    pvVar9 = mmap((void *)0x0,sVar8,3,1,iVar2,__offset);
    if (pvVar9 != (void *)0xffffffffffffffff) goto LAB_00102213;
    *(undefined8 *)((long)auStack_30f0 + lVar1) = 0x10220c;
    vfio_map_region_cold_1();
  }
  pvVar9 = (void *)0xffffffffffffffff;
LAB_00102213:
  return (int)pvVar9;
}

Assistant:

int vfio_enable_msix(int device_fd, uint32_t interrupt_vector) {
	info("Enable MSIX Interrupts");
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];
	struct vfio_irq_set* irq_set;
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	if (!interrupt_vector) {
		interrupt_vector = 1;
	} else if (interrupt_vector > MAX_INTERRUPT_VECTORS)
		interrupt_vector = MAX_INTERRUPT_VECTORS + 1;

	irq_set->count = interrupt_vector;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	fd_ptr[0] = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSIX interrupt");

	return event_fd;
}